

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lp_solver.cc
# Opt level: O3

void __thiscall ipx::LpSolver::ClearIPMStartingPoint(LpSolver *this)

{
  double *pdVar1;
  
  if ((this->x_start_)._M_size != 0) {
    operator_delete((this->x_start_)._M_data);
    (this->x_start_)._M_size = 0;
    pdVar1 = (double *)operator_new(0);
    (this->x_start_)._M_data = pdVar1;
  }
  if ((this->xl_start_)._M_size != 0) {
    operator_delete((this->xl_start_)._M_data);
    (this->xl_start_)._M_size = 0;
    pdVar1 = (double *)operator_new(0);
    (this->xl_start_)._M_data = pdVar1;
  }
  if ((this->xu_start_)._M_size != 0) {
    operator_delete((this->xu_start_)._M_data);
    (this->xu_start_)._M_size = 0;
    pdVar1 = (double *)operator_new(0);
    (this->xu_start_)._M_data = pdVar1;
  }
  if ((this->y_start_)._M_size != 0) {
    operator_delete((this->y_start_)._M_data);
    (this->y_start_)._M_size = 0;
    pdVar1 = (double *)operator_new(0);
    (this->y_start_)._M_data = pdVar1;
  }
  if ((this->zl_start_)._M_size != 0) {
    operator_delete((this->zl_start_)._M_data);
    (this->zl_start_)._M_size = 0;
    pdVar1 = (double *)operator_new(0);
    (this->zl_start_)._M_data = pdVar1;
  }
  if ((this->zu_start_)._M_size != 0) {
    operator_delete((this->zu_start_)._M_data);
    (this->zu_start_)._M_size = 0;
    pdVar1 = (double *)operator_new(0);
    (this->zu_start_)._M_data = pdVar1;
  }
  return;
}

Assistant:

void LpSolver::ClearIPMStartingPoint() {
    x_start_.resize(0);
    xl_start_.resize(0);
    xu_start_.resize(0);
    y_start_.resize(0);
    zl_start_.resize(0);
    zu_start_.resize(0);
}